

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  Auto *pAVar2;
  element_type *peVar3;
  ostream *poVar4;
  long lVar5;
  element_type *peVar6;
  reference psVar7;
  element_type *peVar8;
  double __val;
  double __val_00;
  double extraout_XMM0_Qa;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [8];
  AutoPtr c;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_> *__range1;
  double totalWeight;
  shared_ptr<Auto> local_170;
  undefined1 local_160 [8];
  vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_> cars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  shared_ptr<Truck> myTruck;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_28 [8];
  shared_ptr<SedanCar> myAuto;
  char **argv_local;
  int argc_local;
  
  myAuto.super___shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  std::make_shared<SedanCar>();
  pAVar2 = &std::__shared_ptr_access<SedanCar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<SedanCar,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_28)->super_Auto;
  Auto::setNoOfPassengers(pAVar2,4);
  pAVar2 = &std::__shared_ptr_access<SedanCar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<SedanCar,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_28)->super_Auto;
  Auto::setTailLoad(pAVar2,101.5);
  peVar3 = std::__shared_ptr_access<SedanCar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<SedanCar,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_28);
  (*(peVar3->super_Auto)._vptr_Auto[2])();
  std::__cxx11::to_string(&local_78,__val);
  std::operator+(&local_58,"Total weight of my Sedan Car is: ",&local_78);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_58);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  lVar5 = std::__shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>::use_count
                    ((__shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  std::__cxx11::to_string
            ((string *)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             lVar5);
  std::operator+(&local_98,"No of References : ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_98);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string
            ((string *)&myTruck.super___shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar4 = std::operator<<((ostream *)&std::cout,"=======   Separator  ======== ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::make_shared<Truck>();
  pAVar2 = &std::__shared_ptr_access<Truck,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Truck,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_c8)->super_Auto;
  Auto::setNoOfPassengers(pAVar2,2);
  pAVar2 = &std::__shared_ptr_access<Truck,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Truck,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_c8)->super_Auto;
  Auto::setTailLoad(pAVar2,500.5);
  peVar6 = std::__shared_ptr_access<Truck,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Truck,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_c8);
  (*(peVar6->super_Auto)._vptr_Auto[2])();
  std::__cxx11::to_string(&local_108,__val_00);
  std::operator+(&local_e8,"Total weight of my Truck Car is: ",&local_108);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_e8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  lVar5 = std::__shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>::use_count
                    ((__shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
  std::__cxx11::to_string
            ((string *)
             &cars.
              super__Vector_base<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,lVar5);
  std::operator+(&local_128,"No of References : ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cars.
                  super__Vector_base<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_128);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string
            ((string *)
             &cars.
              super__Vector_base<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar4 = std::operator<<((ostream *)&std::cout,"=======   Separator  ======== ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>::vector
            ((vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_> *)local_160);
  std::shared_ptr<Auto>::shared_ptr<SedanCar,void>(&local_170,(shared_ptr<SedanCar> *)local_28);
  std::vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>::push_back
            ((vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_> *)local_160,
             &local_170);
  std::shared_ptr<Auto>::~shared_ptr(&local_170);
  std::shared_ptr<Auto>::shared_ptr<Truck,void>
            ((shared_ptr<Auto> *)&totalWeight,(shared_ptr<Truck> *)local_c8);
  std::vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>::push_back
            ((vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_> *)local_160,
             (shared_ptr<Auto> *)&totalWeight);
  std::shared_ptr<Auto>::~shared_ptr((shared_ptr<Auto> *)&totalWeight);
  __range1 = (vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_> *)0x0;
  __end1 = std::vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>::begin
                     ((vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_> *)
                      local_160);
  c.super___shared_ptr<Auto,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>::end
                 ((vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_> *)
                  local_160);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<Auto>_*,_std::vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>_>
                                *)&c.super___shared_ptr<Auto,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (!bVar1) break;
    psVar7 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<Auto>_*,_std::vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<Auto>::shared_ptr((shared_ptr<Auto> *)local_1b0,psVar7);
    peVar8 = std::__shared_ptr_access<Auto,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Auto,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_1b0);
    (*peVar8->_vptr_Auto[2])();
    __range1 = (vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_> *)
               (extraout_XMM0_Qa + (double)__range1);
    std::shared_ptr<Auto>::~shared_ptr((shared_ptr<Auto> *)local_1b0);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Auto>_*,_std::vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>_>
    ::operator++(&__end1);
  }
  std::operator<<((ostream *)&std::cout,"Total weight of my cars are: ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(double)__range1);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"=======   Separator  ======== ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "Now Objects have no references and are removed from memory automatically."
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"=======   Separator  ======== ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  lVar5 = std::__shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2>::use_count
                    ((__shared_ptr<SedanCar,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  std::__cxx11::to_string(&local_1f0,lVar5);
  std::operator+(&local_1d0,"No of References : ",&local_1f0);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_1d0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  lVar5 = std::__shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2>::use_count
                    ((__shared_ptr<Truck,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
  std::__cxx11::to_string(&local_230,lVar5);
  std::operator+(&local_210,"No of References : ",&local_230);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_210);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  poVar4 = std::operator<<((ostream *)&std::cout,"=======   Separator  ======== ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_>::~vector
            ((vector<std::shared_ptr<Auto>,_std::allocator<std::shared_ptr<Auto>_>_> *)local_160);
  std::shared_ptr<Truck>::~shared_ptr((shared_ptr<Truck> *)local_c8);
  std::shared_ptr<SedanCar>::~shared_ptr((shared_ptr<SedanCar> *)local_28);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

	// Create 3 Objects
	// No deletes and no new operators are used.

	// This is my Auto.
	auto myAuto = std::make_shared<SedanCar>();
	myAuto->setNoOfPassengers(4);
	myAuto->setTailLoad(double(101.5));

	std::cout
			<< "Total weight of my Sedan Car is: "
					+ std::to_string(myAuto->getTotalWeight()) << std::endl;
	std::cout << "No of References : " + std::to_string(myAuto.use_count())
			<< std::endl;
	std::cout << "=======   Separator  ======== " << std::endl;

	// And this is my truck.
	auto myTruck = std::make_shared<Truck>();
	myTruck->setNoOfPassengers(2);
	myTruck->setTailLoad(double(500.50));

	std::cout
			<< "Total weight of my Truck Car is: "
					+ std::to_string(myTruck->getTotalWeight()) << std::endl;

	std::cout << "No of References : " + std::to_string(myTruck.use_count())
			<< std::endl;

	std::cout << "=======   Separator  ======== " << std::endl;

	// Now let us make a vector of my cars.
	std::vector<AutoPtr> cars;
	cars.push_back(myAuto);
	cars.push_back(myTruck);

	double totalWeight = 0;

	for (AutoPtr c : cars) {
		totalWeight += c->getTotalWeight();
	}

	std::cout << "Total weight of my cars are: ";
	std::cout << +totalWeight << std::endl;

	std::cout << "=======   Separator  ======== " << std::endl;

	std::cout
			<< "Now Objects have no references and are removed from memory automatically."
			<< std::endl;

	std::cout << "=======   Separator  ======== " << std::endl;

	std::cout << "No of References : " + std::to_string(myAuto.use_count())
			<< std::endl;
	std::cout << "No of References : " + std::to_string(myTruck.use_count())
			<< std::endl;


	// No need to do the delete operations
	// Objects will be reference counted.

// Running Valgrind as test

// $ valgrind -v ./Example-1
//     ==4516==
//     ==4516== HEAP SUMMARY:
//     ==4516==     in use at exit: 0 bytes in 0 blocks
//     ==4516==   total heap usage: 6 allocs, 6 frees, 73,888 bytes allocated
//     ==4516==
//     ==4516== All heap blocks were freed -- no leaks are possible
//     ==4516==
//     ==4516== ERROR SUMMARY: 0 errors from 0 contexts (suppressed: 0 from 0)
//     ==4516== ERROR SUMMARY: 0 errors from 0 contexts (suppressed: 0 from 0)


	std::cout << "=======   Separator  ======== " << std::endl;

	return 0;
}